

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type * __thiscall
FadBinaryPow<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::fastAccessDx
          (value_type *__return_storage_ptr__,
          FadBinaryPow<Fad<Fad<double>_>,_Fad<Fad<double>_>_> *this,int i)

{
  Fad<double> *pFVar1;
  undefined1 local_c8 [32];
  FadExpr<FadFuncLog<Fad<double>_>_> local_a8;
  FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_> local_80;
  Fad<double> *local_70;
  Fad<double> *local_68;
  FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncLog<Fad<double>_>_>_>_> local_60;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncLog<Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  local_50;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncLog<Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>_>_>
  local_40;
  
  pFVar1 = (this->right_->dx_).ptr_to_data;
  FadFuncLog<Fad<double>_>::FadFuncLog((FadFuncLog<Fad<double>_> *)local_c8,&this->left_->val_);
  FadExpr<FadFuncLog<Fad<double>_>_>::FadExpr(&local_a8,(FadFuncLog<Fad<double>_> *)local_c8);
  Fad<double>::~Fad((Fad<double> *)local_c8);
  local_50.fadexpr_.left_ = &local_60;
  local_68 = (this->left_->dx_).ptr_to_data + i;
  local_80.fadexpr_.right_ = &this->right_->val_;
  local_c8._0_8_ = &local_70;
  local_c8._8_8_ = &this->left_->val_;
  local_40.fadexpr_.left_ = &local_50;
  local_40.fadexpr_.right_ = &local_80;
  local_80.fadexpr_.left_ = (Fad<double> *)local_c8._8_8_;
  local_70 = local_80.fadexpr_.right_;
  local_60.fadexpr_.left_ = pFVar1 + i;
  local_60.fadexpr_.right_ = &local_a8;
  local_50.fadexpr_.right_ =
       (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> *)
       local_c8;
  Fad<double>::
  Fad<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,FadExpr<FadFuncLog<Fad<double>>>>>,FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryPow<Fad<double>,Fad<double>>>>>
            (__return_storage_ptr__,&local_40);
  Fad<double>::~Fad(&local_a8.fadexpr_.expr_);
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const 
    {
      return  (right_.fastAccessDx(i)*log(left_.val())+right_.val()*left_.fastAccessDx(i)/left_.val())
	*pow( left_.val(), right_.val() );
    }